

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

map_index_t __thiscall
google::protobuf::internal::UntypedMapBase::VariantBucketNumber(UntypedMapBase *this,VariantKey key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t v_1;
  MixingHashState MVar3;
  ulong uVar4;
  size_t size;
  uint64_t v;
  
  size = key.integral;
  if ((uchar *)key.data == (uchar *)0x0) {
    uVar4 = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed + (this->seed_ ^ size);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                   (ulong)this->seed_;
    MVar3 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                      ((MixingHashState)
                       (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0)),(uchar *)key.data,size);
    uVar4 = MVar3.state_ + size;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  return (SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),8)) & this->num_buckets_ - 1;
}

Assistant:

map_index_t VariantBucketNumber(VariantKey key) const {
    return key.data == nullptr
               ? VariantBucketNumber(key.integral)
               : VariantBucketNumber(absl::string_view(
                     key.data, static_cast<size_t>(key.integral)));
  }